

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

matches * atomsestart(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  matches *pmVar2;
  match *pmVar3;
  expr *peVar4;
  expr **ppeVar5;
  int iVar6;
  
  if (ctx->reverse == 0) {
    peVar4 = (expr *)calloc(0x48,1);
    peVar4->type = EXPR_SESTART;
    iVar6 = ctx->atomsnum;
    iVar1 = ctx->atomsmax;
    if (iVar6 < iVar1) {
      ppeVar5 = ctx->atoms;
    }
    else {
      iVar6 = 0x10;
      if (iVar1 != 0) {
        iVar6 = iVar1 * 2;
      }
      ctx->atomsmax = iVar6;
      ppeVar5 = (expr **)realloc(ctx->atoms,(long)iVar6 << 3);
      ctx->atoms = ppeVar5;
      iVar6 = ctx->atomsnum;
    }
    ctx->atomsnum = iVar6 + 1;
    ppeVar5[iVar6] = peVar4;
  }
  else if (ctx->line->atoms[spos]->type == EXPR_SESTART) {
    pmVar2 = (matches *)calloc(0x10,1);
    pmVar2->mmax = 0x10;
    pmVar3 = (match *)malloc(0xb80);
    pmVar2->m = pmVar3;
    pmVar2->mnum = 1;
    *(undefined8 *)pmVar3 = 0;
    pmVar3->a[0] = 0;
    pmVar3->a[1] = 0;
    pmVar3->m[0] = 0;
    pmVar3->m[1] = 0;
    pmVar3->lpos = spos + 1;
    memset(&pmVar3->field_0x2c,0,0x8c);
    return pmVar2;
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomsestart APROTO {
	if (!ctx->reverse) {
		struct expr *expr = makeex(EXPR_SESTART);
		ADDARRAY(ctx->atoms, expr);
		return NULL;
	} else {
		struct expr *e = ctx->line->atoms[spos];
		if (e->type == EXPR_SESTART)
			return alwaysmatches(spos+1);
		else
			return 0;
	}
}